

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::PointLightSource::writeTo(PointLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::writeRaw(binary,&this->from,0xc);
  BinaryWriter::writeRaw(binary,&this->I,0xc);
  (*(this->Ispectrum).super_Entity._vptr_Entity[1])(&this->Ispectrum,binary);
  BinaryWriter::writeRaw(binary,&this->scale,0xc);
  return 0x49;
}

Assistant:

int PointLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(scale);
    return TYPE_POINT_LIGHT_SOURCE;
  }